

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType BVar1;
  Type TVar2;
  HeapType local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  TVar2.id = (uintptr_t)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x200),0x10,8);
  *(undefined1 *)TVar2.id = 0x29;
  *(undefined8 *)(TVar2.id + 8) = 0;
  BVar1 = HeapType::getBottom(&local_20);
  if (((uint)(0x7c < BVar1) * 4 + 3 & BVar1) == 0) {
    wasm::RefNull::finalize(TVar2);
    return (RefNull *)TVar2.id;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }